

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O0

string * jsonnet::internal::encode_utf8(UString *s)

{
  UString *in_RSI;
  string *in_RDI;
  string *r;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  encode_utf8(in_RSI,(string *)CONCAT17(uVar1,in_stack_ffffffffffffffe8));
  return in_RDI;
}

Assistant:

static inline std::string encode_utf8(const UString &s)
{
    std::string r;
    encode_utf8(s, r);
    return r;
}